

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckBox.cpp
# Opt level: O0

shared_ptr<gui::CheckBox> gui::CheckBox::create(shared_ptr<gui::CheckBoxStyle> *style,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::CheckBox> sVar1;
  element_type *this;
  String *in_stack_ffffffffffffffd0;
  shared_ptr<gui::CheckBoxStyle> *in_stack_ffffffffffffffd8;
  CheckBox *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  operator_new(0x2e8);
  std::shared_ptr<gui::CheckBoxStyle>::shared_ptr
            ((shared_ptr<gui::CheckBoxStyle> *)this,(shared_ptr<gui::CheckBoxStyle> *)in_RDI);
  CheckBox(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::shared_ptr<gui::CheckBox>::shared_ptr<gui::CheckBox,void>
            ((shared_ptr<gui::CheckBox> *)this,in_RDI);
  std::shared_ptr<gui::CheckBoxStyle>::~shared_ptr((shared_ptr<gui::CheckBoxStyle> *)0x185086);
  sVar1.super___shared_ptr<gui::CheckBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::CheckBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::CheckBox>)
         sVar1.super___shared_ptr<gui::CheckBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CheckBox> CheckBox::create(std::shared_ptr<CheckBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<CheckBox>(new CheckBox(style, name));
}